

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vbitmap.h
# Opt level: O2

void __thiscall
VBitmap::Impl::Impl(Impl *this,uint8_t *data,size_t w,size_t h,size_t bytesPerLine,Format format)

{
  *(undefined8 *)((long)&this->mRoData + 6) = 0;
  *(undefined8 *)((long)&this->mHeight + 2) = 0;
  (this->mOwnData)._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>.
  _M_t.super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
  super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl = (uchar *)0x0;
  this->mRoData = (uint8_t *)0x0;
  reset(this,data,w,h,bytesPerLine,format);
  return;
}

Assistant:

explicit Impl(uint8_t *data, size_t w, size_t h, size_t bytesPerLine,
                      VBitmap::Format format)
        {
            reset(data, w, h, bytesPerLine, format);
        }